

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

bool __thiscall
Potassco::AspifTextOutput::assignAtomName(AspifTextOutput *this,Atom_t atom,string *str)

{
  char cVar1;
  __type _Var2;
  bool bVar3;
  char *pcVar4;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  *pvVar5;
  reference pppVar6;
  ulong uVar7;
  long lVar8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *this_00;
  reference ppVar9;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  *this_01;
  undefined1 uVar10;
  ulong in_RDX;
  uint in_ESI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar11;
  StringMapNode node;
  char *x;
  StringMapNode node_1;
  bool theory;
  uint *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  size_type in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  Data *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffffb8;
  Data *in_stack_ffffffffffffffc0;
  bool local_1;
  
  if (in_ESI <= *(uint *)(in_RDI + 0x2c)) {
    return false;
  }
  pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX);
  cVar1 = *pcVar4;
  this_01 = (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
             *)(ulong)in_ESI;
  pvVar5 = (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
            *)std::
              vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
              ::size((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                      *)(*(long *)(in_RDI + 0x18) + 0x50));
  if (pvVar5 <= this_01) {
    std::
    vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
    ::resize(this_01,in_stack_ffffffffffffff48,
             (value_type *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  }
  pppVar6 = std::
            vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
            ::operator[]((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                          *)(*(long *)(in_RDI + 0x18) + 0x50),(ulong)in_ESI);
  if (*pppVar6 != (value_type)0x0) {
    if (((*pppVar6)->second == in_ESI) &&
       (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                in_stack_ffffffffffffff38), _Var2)) {
      return true;
    }
    Data::convertToOutput
              (in_stack_ffffffffffffff70,
               (StringMapNode)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68));
    if (cVar1 != '&') {
      return false;
    }
  }
  uVar7 = std::__cxx11::string::size();
  if (((2 < uVar7) && (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar4 == 'x'))
     && (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar4 == '_')) {
    lVar8 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffffc0 = (Data *)(lVar8 + 2);
    while (bVar3 = BufferedStream::isDigit
                             (*(char *)&(in_stack_ffffffffffffffc0->directives).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start), bVar3) {
      in_stack_ffffffffffffffc0 =
           (Data *)((long)&(in_stack_ffffffffffffffc0->directives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 1);
    }
    if (*(char *)&(in_stack_ffffffffffffffc0->directives).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start == '\0') {
      Data::setGenName(in_stack_ffffffffffffffc0,(Atom_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
      ;
      return false;
    }
  }
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)(*(long *)(in_RDI + 0x18) + 0x18);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<unsigned_int_&,_true>(this_00,&in_stack_ffffffffffffff28->first,in_stack_ffffffffffffff20);
  pVar11 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)this_00,in_stack_ffffffffffffff28);
  uVar10 = pVar11.second;
  ppVar9 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
           ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                        *)0x10fc2c);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)0x10fc3b);
  if ((ppVar9->second == in_ESI) || (ppVar9->second == 0xffffffff)) {
    ppVar9->second = in_ESI;
    pppVar6 = std::
              vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
              ::operator[]((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                            *)(*(long *)(in_RDI + 0x18) + 0x50),(ulong)in_ESI);
    *pppVar6 = ppVar9;
    local_1 = true;
  }
  else {
    if (*(uint *)(in_RDI + 0x2c) < ppVar9->second) {
      Data::convertToOutput
                (in_stack_ffffffffffffff70,(StringMapNode)CONCAT71(in_stack_ffffffffffffff69,uVar10)
                );
    }
    Data::setGenName(in_stack_ffffffffffffffc0,(Atom_t)((ulong)ppVar9 >> 0x20));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AspifTextOutput::assignAtomName(Atom_t atom, const std::string& str) {
	if (atom <= maxAtom_) {
		return false;
	}
	assert(!str.empty());
	bool theory = str[0] == '&';
	if (atom >= data_->atoms.size()) { data_->atoms.resize(atom + 1, 0); }
	if (Data::StringMapNode node = data_->atoms[atom]) { // atom already has a tentative name
		if (node->second == atom && node->first == str) {
			return true; // identical name, ignore duplicate
		}
		data_->convertToOutput(node); // drop assignment
		if (!theory) {
			return false;
		}
	}
	if (str.size() > 2 && str[0] == 'x' && str[1] == '_') {
		const char* x = str.c_str() + 2;
		while (BufferedStream::isDigit(*x)) { ++x; }
		if (!*x) {
			data_->setGenName(atom);
			return false;
		}
	}
	Data::StringMapNode node = &*data_->strings.insert(Data::StringMapVal(str, atom)).first;
	if (node->second == atom || node->second == idMax) { // assign tentative name to atom
		node->second       = atom;
		data_->atoms[atom] = node;
		return true;
	}
	// name already used: drop previous (tentative) assigment and prevent further assignments
	if (node->second > maxAtom_) {
		data_->convertToOutput(node);
	}
	data_->setGenName(atom);
	return false;
}